

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_integer_attribute_decoder.cc
# Opt level: O0

void __thiscall
draco::SequentialIntegerAttributeDecoder::PreparePortableAttribute
          (SequentialIntegerAttributeDecoder *this,int num_entries,int num_components)

{
  int32_t iVar1;
  uint32_t id;
  PointAttribute *pPVar2;
  pointer this_00;
  int in_EDX;
  pointer __p;
  PointAttribute *in_RDI;
  unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> port_att;
  GeometryAttribute ga;
  GeometryAttribute *in_stack_ffffffffffffff30;
  SequentialAttributeDecoder *this_01;
  DataType in_stack_ffffffffffffff38;
  uint8_t in_stack_ffffffffffffff3f;
  DataBuffer *in_stack_ffffffffffffff40;
  unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> *this_02;
  undefined4 in_stack_ffffffffffffff48;
  Type in_stack_ffffffffffffff4c;
  PointAttribute *in_stack_ffffffffffffff50;
  int64_t in_stack_ffffffffffffff60;
  undefined1 *num_attribute_values;
  unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> local_70 [3];
  undefined1 local_58 [72];
  int local_10;
  
  local_10 = in_EDX;
  GeometryAttribute::GeometryAttribute(in_stack_ffffffffffffff30);
  pPVar2 = SequentialAttributeDecoder::attribute((SequentialAttributeDecoder *)in_RDI);
  GeometryAttribute::attribute_type(&pPVar2->super_GeometryAttribute);
  iVar1 = DataTypeLength(DT_INT32);
  __p = (pointer)(long)(local_10 * iVar1);
  this_01 = (SequentialAttributeDecoder *)0x0;
  GeometryAttribute::Init
            (&in_stack_ffffffffffffff50->super_GeometryAttribute,in_stack_ffffffffffffff4c,
             in_stack_ffffffffffffff40,in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38,false,
             in_stack_ffffffffffffff60,(int64_t)in_RDI);
  operator_new(0x70);
  PointAttribute::PointAttribute
            (in_stack_ffffffffffffff50,
             (GeometryAttribute *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  num_attribute_values = local_58;
  std::unique_ptr<draco::PointAttribute,std::default_delete<draco::PointAttribute>>::
  unique_ptr<std::default_delete<draco::PointAttribute>,void>
            ((unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> *)
             this_01,__p);
  std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>::operator->
            ((unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> *)
             0x20a715);
  PointAttribute::SetIdentityMapping((PointAttribute *)0x20a71d);
  std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>::operator->
            ((unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> *)
             0x20a72c);
  PointAttribute::Reset(in_RDI,(size_t)num_attribute_values);
  this_00 = std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>::
            operator->((unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                        *)0x20a74b);
  pPVar2 = SequentialAttributeDecoder::attribute((SequentialAttributeDecoder *)in_RDI);
  id = GeometryAttribute::unique_id(&pPVar2->super_GeometryAttribute);
  GeometryAttribute::set_unique_id(&this_00->super_GeometryAttribute,id);
  this_02 = local_70;
  std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>::unique_ptr
            ((unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> *)
             this_01,(unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                      *)__p);
  SequentialAttributeDecoder::SetPortableAttribute
            (this_01,(unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                      *)__p);
  std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>::~unique_ptr
            (this_02);
  std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>::~unique_ptr
            (this_02);
  return;
}

Assistant:

void SequentialIntegerAttributeDecoder::PreparePortableAttribute(
    int num_entries, int num_components) {
  GeometryAttribute ga;
  ga.Init(attribute()->attribute_type(), nullptr, num_components, DT_INT32,
          false, num_components * DataTypeLength(DT_INT32), 0);
  std::unique_ptr<PointAttribute> port_att(new PointAttribute(ga));
  port_att->SetIdentityMapping();
  port_att->Reset(num_entries);
  port_att->set_unique_id(attribute()->unique_id());
  SetPortableAttribute(std::move(port_att));
}